

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

void COST_SENSITIVE::output_example(vw *all,example *ec)

{
  polylabel *v;
  v_array<char> *pvVar1;
  int iVar2;
  shared_data *this;
  int *piVar3;
  namedlabels *this_00;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  v_array<char> vVar6;
  bool bVar7;
  bool bVar8;
  ostream *poVar9;
  wclass *cl;
  wclass *pwVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  substring sVar18;
  float local_218;
  float local_210;
  undefined4 uStack_20c;
  v_array<COST_SENSITIVE::wclass> *__range2;
  size_t local_200;
  string local_1f8 [32];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream outputStringStream;
  ostream local_1a8;
  
  v = &ec->l;
  bVar7 = test_label(v);
  if (bVar7) {
    local_218 = ec->weight;
    local_210 = 0.0;
  }
  else {
    fVar16 = 3.4028235e+38;
    fVar17 = 3.4028235e+38;
    for (pwVar10 = (ec->l).cs.costs._begin; pwVar10 != (ec->l).cs.costs._end; pwVar10 = pwVar10 + 1)
    {
      fVar14 = pwVar10->x;
      fVar15 = fVar14;
      if (pwVar10->class_index != (ec->pred).multiclass) {
        fVar15 = fVar16;
      }
      if (fVar17 <= fVar14) {
        fVar14 = fVar17;
      }
      fVar16 = fVar15;
      fVar17 = fVar14;
    }
    if ((fVar16 == 3.4028235e+38) && (!NAN(fVar16))) {
      poVar9 = std::operator<<((ostream *)&std::cerr,
                               "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?"
                              );
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    local_218 = ec->weight;
    local_210 = (fVar16 - fVar17) * local_218;
  }
  this = all->sd;
  bVar7 = ec->test_only;
  bVar8 = test_label(v);
  shared_data::update(this,bVar7,!bVar8,local_210,local_218,ec->num_features);
  piVar13 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  local_210 = SUB84(piVar3,0);
  uStack_20c = (undefined4)((ulong)piVar3 >> 0x20);
  pvVar1 = &ec->tag;
  for (; piVar13 != piVar3; piVar13 = piVar13 + 1) {
    iVar2 = *piVar13;
    this_00 = all->sd->ldict;
    if (this_00 == (namedlabels *)0x0) {
      (*all->print)(iVar2,(float)(ec->pred).multiclass,0.0,*pvVar1);
    }
    else {
      sVar18 = namedlabels::get(this_00,(ec->pred).multiclass);
      p_Var4 = all->print_text;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,sVar18.begin,sVar18.end);
      vVar5._end._0_4_ = local_210;
      vVar5._begin = (char *)pvVar1;
      vVar5._end._4_4_ = uStack_20c;
      vVar5.end_array = (char *)v;
      vVar5.erase_count = local_200;
      (*p_Var4)(iVar2,(string)*pvVar1,vVar5);
      std::__cxx11::string::~string((string *)local_1d8);
    }
  }
  if (0 < all->raw_prediction) {
    std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
    uVar11 = 0;
    while( true ) {
      uVar12 = (ulong)uVar11;
      pwVar10 = (ec->l).cs.costs._begin;
      if ((ulong)((long)(ec->l).cs.costs._end - (long)pwVar10 >> 4) <= uVar12) break;
      local_210 = pwVar10[uVar12].partial_prediction;
      if (uVar12 != 0) {
        std::operator<<(&local_1a8,' ');
      }
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      poVar9 = std::operator<<(poVar9,':');
      std::ostream::operator<<(poVar9,local_210);
      uVar11 = uVar11 + 1;
    }
    p_Var4 = all->print_text;
    iVar2 = all->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar6._end._0_4_ = local_210;
    vVar6._begin = (char *)pvVar1;
    vVar6._end._4_4_ = uStack_20c;
    vVar6.end_array = (char *)v;
    vVar6.erase_count = (size_t)all;
    (*p_Var4)(iVar2,(string)*pvVar1,vVar6);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  }
  bVar7 = test_label(v);
  print_update(all,bVar7,ec,(multi_ex *)0x0,false,(ec->pred).multiclass);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  label& ld = ec.l.cs;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    size_t pred = (size_t)ec.pred.multiclass;

    float chosen_loss = FLT_MAX;
    float min = FLT_MAX;
    for (auto& cl : ld.costs)
    {
      if (cl.class_index == pred)
        chosen_loss = cl.x;
      if (cl.x < min)
        min = cl.x;
    }
    if (chosen_loss == FLT_MAX)
      cerr << "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?" << endl;

    loss = (chosen_loss - min) * ec.weight;
    // TODO(alberto): add option somewhere to allow using absolute loss instead?
    // loss = chosen_loss;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      wclass cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.class_index << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, test_label(&ec.l.cs), ec, nullptr, false, ec.pred.multiclass);
}